

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void __thiscall
Printer_prettyPrintSpacesNewlines_Test::~Printer_prettyPrintSpacesNewlines_Test
          (Printer_prettyPrintSpacesNewlines_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Printer, prettyPrintSpacesNewlines)
{
    auto printer = libcellml::Printer::create();
    auto model = libcellml::Model::create();
    model->setName("model");

    auto component1 = libcellml::Component::create("component");
    model->addComponent(component1);
    const std::string equation1 =
        "  <apply><eq/>\n"
        "    <apply><diff/>\n"
        "      <bvar><ci>t</ci></bvar>\n"
        "      <ci>X</ci>\n"
        "    </apply>\n"
        "    <apply><minus/>\n"
        "      <apply><times/>\n"
        "        <ci>alpha_X</ci>\n"
        "        <apply><minus/>\n"
        "          <cn cellml:units=\"dimensionless\">1</cn>\n"
        "          <ci>X</ci>\n"
        "        </apply>\n"
        "      </apply>\n"
        "      <apply><times/>\n"
        "        <ci>beta_X</ci>\n"
        "        <ci>X</ci>\n"
        "      </apply>\n"
        "    </apply>\n"
        "  </apply>\n";
    component1->setMath(MATH_HEADER);
    component1->appendMath(equation1);
    component1->appendMath(MATH_FOOTER);

    EXPECT_EQ(PRETTY_MODEL_STRING, printer->printModel(model));
}